

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O3

bool jessilib::hex_shrink_sequence_action<char16_t,8ul,true,true>
               (char16_t **in_write_head,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> *read_view)

{
  size_t sVar1;
  char16_t *pcVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  sVar1 = read_view->_M_len;
  uVar3 = 0;
  if (sVar1 != 0) {
    uVar4 = 7;
    if (sVar1 - 1 < 7) {
      uVar4 = sVar1 - 1;
    }
    lVar5 = 0;
    do {
      uVar7 = (ulong)(ushort)read_view->_M_str[lVar5];
      lVar6 = lVar5;
      if ((0x7f < uVar7) || (0xf < (byte)base_table[uVar7])) break;
      uVar3 = uVar3 << 4 | (uint)(byte)base_table[uVar7];
      lVar5 = lVar5 + 1;
      lVar6 = uVar4 + 1;
    } while (uVar4 + 1 != lVar5);
    if (lVar6 == 8) {
      read_view->_M_str = read_view->_M_str + 8;
      read_view->_M_len = sVar1 - 8;
      pcVar2 = *in_write_head;
      if (uVar3 < 0x110000) {
        if (uVar3 < 0x10000) {
          *pcVar2 = (char16_t)uVar3;
          lVar5 = 1;
        }
        else {
          *pcVar2 = (short)(uVar3 + 0x3ff0000 >> 10) + L'\xd800';
          pcVar2[1] = (char16_t)uVar3 & 0x3ffU | 0xdc00;
          lVar5 = 2;
        }
      }
      else {
        lVar5 = 0;
      }
      *in_write_head = pcVar2 + lVar5;
      return true;
    }
  }
  return false;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}